

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abstract_factory.cpp
# Opt level: O2

int main(void)

{
  unique_ptr<Tea,_std::default_delete<Tea>_> tea;
  DrinkWithVolumeFactory dwv;
  DrinkFactory df;
  allocator<char> local_a9;
  unique_ptr<Tea,_std::default_delete<Tea>_> local_a8;
  undefined1 local_a0 [32];
  undefined1 local_80 [8];
  _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<std::unique_ptr<HotDrink,_std::default_delete<HotDrink>_>_()>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<std::unique_ptr<HotDrink,_std::default_delete<HotDrink>_>_()>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  local_78;
  _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<AbstractHotDrinkFactory,_std::default_delete<AbstractHotDrinkFactory>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<AbstractHotDrinkFactory,_std::default_delete<AbstractHotDrinkFactory>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  local_40;
  
  make_drink<Tea>();
  DrinkFactory::DrinkFactory((DrinkFactory *)&local_40);
  std::__cxx11::string::string<std::allocator<char>>((string *)(local_80 + 8),"coffee",&local_a9);
  DrinkFactory::make_drink((DrinkFactory *)local_a0,(string *)&local_40);
  (*(code *)(*(__node_base_ptr *)local_a0._0_8_)->_M_nxt)(0x42c80000);
  std::unique_ptr<HotDrink,_std::default_delete<HotDrink>_>::~unique_ptr
            ((unique_ptr<HotDrink,_std::default_delete<HotDrink>_> *)local_a0);
  std::__cxx11::string::~string((string *)(local_80 + 8));
  DrinkWithVolumeFactory::DrinkWithVolumeFactory((DrinkWithVolumeFactory *)(local_80 + 8));
  std::__cxx11::string::string<std::allocator<char>>((string *)local_a0,"tea",&local_a9);
  DrinkWithVolumeFactory::make((DrinkWithVolumeFactory *)local_80,(string *)(local_80 + 8));
  std::unique_ptr<HotDrink,_std::default_delete<HotDrink>_>::~unique_ptr
            ((unique_ptr<HotDrink,_std::default_delete<HotDrink>_> *)local_80);
  std::__cxx11::string::~string((string *)local_a0);
  std::
  _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<std::unique_ptr<HotDrink,_std::default_delete<HotDrink>_>_()>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<std::unique_ptr<HotDrink,_std::default_delete<HotDrink>_>_()>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  ::~_Hashtable((_Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<std::unique_ptr<HotDrink,_std::default_delete<HotDrink>_>_()>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<std::unique_ptr<HotDrink,_std::default_delete<HotDrink>_>_()>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                 *)(local_80 + 8));
  std::
  _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<AbstractHotDrinkFactory,_std::default_delete<AbstractHotDrinkFactory>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<AbstractHotDrinkFactory,_std::default_delete<AbstractHotDrinkFactory>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  ::~_Hashtable(&local_40);
  std::unique_ptr<Tea,_std::default_delete<Tea>_>::~unique_ptr(&local_a8);
  return 0;
}

Assistant:

int main()
{
	auto tea{make_drink<Tea>()};

	DrinkFactory df;
	df.make_drink("coffee")->prepare(100);
	
	DrinkWithVolumeFactory dwv;
	dwv.make("tea");

	return 0;
}